

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumTextureHandle
pbrt::SpectrumTextureHandle::Create
          (string *name,Transform *renderFromTexture,TextureParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc,bool gpu)

{
  bool bVar1;
  SpectrumBilerpTexture *in_RDI;
  char *in_R9;
  long *in_FS_OFFSET;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  TextureParameterDictionary *in_stack_00000010;
  Transform *in_stack_00000018;
  Allocator in_stack_00000020;
  FileLoc *in_stack_00000038;
  TextureParameterDictionary *in_stack_00000040;
  Transform *in_stack_00000048;
  Allocator in_stack_00000050;
  Transform *in_stack_00000058;
  Allocator in_stack_00000060;
  FileLoc *in_stack_00000068;
  TextureParameterDictionary *in_stack_00000070;
  Transform *in_stack_00000078;
  Allocator in_stack_00000080;
  TextureParameterDictionary *in_stack_00000088;
  Transform *in_stack_00000090;
  Allocator in_stack_00000098;
  FileLoc *in_stack_000000a8;
  undefined7 in_stack_000000b0;
  SpectrumTextureHandle *tex;
  FileLoc *in_stack_00000100;
  TextureParameterDictionary *in_stack_00000108;
  Transform *in_stack_00000110;
  Allocator in_stack_00000118;
  FileLoc *in_stack_00000288;
  TextureParameterDictionary *in_stack_00000290;
  Transform *in_stack_00000298;
  Allocator in_stack_000002a0;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  __lhs;
  Transform *in_stack_ffffffffffffff28;
  Allocator in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  FileLoc *in_stack_ffffffffffffff60;
  FileLoc *in_stack_ffffffffffffff88;
  TextureParameterDictionary *in_stack_ffffffffffffff90;
  Transform *in_stack_ffffffffffffff98;
  Allocator in_stack_ffffffffffffffa0;
  
  __lhs.bits = (uintptr_t)in_RDI;
  SpectrumTextureHandle((SpectrumTextureHandle *)0x4f9c78);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs.bits,(char *)in_RDI);
  if (bVar1) {
    SpectrumConstantTexture::Create
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffffa0);
    TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTextureHandle *)__lhs.bits,(SpectrumConstantTexture *)in_RDI);
    operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs.bits,(char *)in_RDI);
    if (bVar1) {
      SpectrumScaledTexture::Create
                (in_stack_00000090,in_stack_00000088,(FileLoc *)in_stack_00000080.memoryResource,
                 in_stack_00000098);
      operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.bits,(char *)in_RDI);
      if (bVar1) {
        SpectrumMixTexture::Create
                  (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000050);
        TaggedPointer<pbrt::SpectrumMixTexture>
                  ((SpectrumTextureHandle *)__lhs.bits,(SpectrumMixTexture *)in_RDI);
        operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.bits,(char *)in_RDI);
        if (bVar1) {
          SpectrumBilerpTexture::Create
                    ((Transform *)loc,(TextureParameterDictionary *)CONCAT17(gpu,in_stack_000000b0),
                     in_stack_000000a8,(Allocator)parameters);
          TaggedPointer<pbrt::SpectrumBilerpTexture>((SpectrumTextureHandle *)__lhs.bits,in_RDI);
          operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs.bits,(char *)in_RDI);
          if (bVar1) {
            if ((in_stack_00000008 & 1) == 0) {
              SpectrumImageTexture::Create
                        (in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_000002a0);
              TaggedPointer<pbrt::SpectrumImageTexture>
                        ((SpectrumTextureHandle *)__lhs.bits,(SpectrumImageTexture *)in_RDI);
              operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
            }
            else {
              GPUSpectrumImageTexture::Create
                        (in_stack_ffffffffffffff28,(TextureParameterDictionary *)__lhs.bits,
                         (FileLoc *)in_RDI,in_stack_ffffffffffffff30);
              TaggedPointer<pbrt::GPUSpectrumImageTexture>
                        ((SpectrumTextureHandle *)__lhs.bits,(GPUSpectrumImageTexture *)in_RDI);
              operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs.bits,(char *)in_RDI);
            if (bVar1) {
              SpectrumCheckerboardTexture::Create
                        (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_00000118);
              TaggedPointer<pbrt::SpectrumCheckerboardTexture>
                        ((SpectrumTextureHandle *)__lhs.bits,(SpectrumCheckerboardTexture *)in_RDI);
              operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
              in_stack_ffffffffffffff58 = in_R9;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs.bits,(char *)in_RDI);
              if (bVar1) {
                SpectrumDotsTexture::Create
                          (in_stack_00000018,in_stack_00000010,
                           (FileLoc *)CONCAT71(in_stack_00000009,in_stack_00000008),
                           in_stack_00000020);
                TaggedPointer<pbrt::SpectrumDotsTexture>
                          ((SpectrumTextureHandle *)__lhs.bits,(SpectrumDotsTexture *)in_RDI);
                operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs.bits,(char *)in_RDI);
                if (bVar1) {
                  MarbleTexture::Create
                            (in_stack_00000058,
                             (TextureParameterDictionary *)in_stack_00000050.memoryResource,
                             (FileLoc *)in_stack_00000048,in_stack_00000060);
                  TaggedPointer<pbrt::MarbleTexture>
                            ((SpectrumTextureHandle *)__lhs.bits,(MarbleTexture *)in_RDI);
                  operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs.bits,(char *)in_RDI);
                  if (!bVar1) {
                    ErrorExit<std::__cxx11::string_const&>
                              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                               in_stack_ffffffffffffff50);
                  }
                  if ((in_stack_00000008 & 1) != 0) {
                    ErrorExit((FileLoc *)__lhs.bits,(char *)in_RDI);
                  }
                  SpectrumPtexTexture::Create
                            (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000080
                            );
                  TaggedPointer<pbrt::SpectrumPtexTexture>
                            ((SpectrumTextureHandle *)__lhs.bits,(SpectrumPtexTexture *)in_RDI);
                  operator=((SpectrumTextureHandle *)__lhs.bits,(SpectrumTextureHandle *)in_RDI);
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (bVar1) {
    *(long *)(*in_FS_OFFSET + -0x5a8) = *(long *)(*in_FS_OFFSET + -0x5a8) + 1;
    return (SpectrumTextureHandle)
           (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
            )__lhs.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
}

Assistant:

SpectrumTextureHandle SpectrumTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc,
    bool gpu) {
    SpectrumTextureHandle tex;
    if (name == "constant")
        tex = SpectrumConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = SpectrumScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = SpectrumMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = SpectrumBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUSpectrumImageTexture::Create(renderFromTexture, parameters, loc,
                                                  alloc);
        else
            tex = SpectrumImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = SpectrumCheckerboardTexture::Create(renderFromTexture, parameters, loc,
                                                  alloc);
    else if (name == "dots")
        tex = SpectrumDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "marble")
        tex = MarbleTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = SpectrumPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: spectrum texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}